

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall
chrono::robosimian::RS_Chassis::RS_Chassis
          (RS_Chassis *this,string *name,bool fixed,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system)

{
  vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_> *this_00;
  vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  *this_01;
  ChFrame *pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChVector<double> inertia_xy;
  ChVector<double> inertia_xx;
  ChQuaternion<double> local_148;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  shared_ptr<chrono::ChMaterialSurface> local_118;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  double local_d8;
  double local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined1 local_b8 [72];
  double local_70;
  
  local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  RS_Part::RS_Part(&this->super_RS_Part,name,&local_118,system);
  if (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_Part_0017d9b8;
  (this->super_RS_Part).field_0xec = 0;
  local_f0 = 0x3ff45aa92e62131b;
  local_e8 = 0x40048cda6e75ff61;
  local_e0 = 0x4008b224aada33be;
  local_108 = 0x3f8234eb9a176ddb;
  local_100 = 0xbfc1d883ba3443d4;
  local_f8 = 0x3f354c985f06f694;
  *(undefined4 *)
   ((this->super_RS_Part).m_body.
    super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28) = 0;
  chrono::ChVariablesBodyOwnMass::SetBodyMass(46.658335);
  pCVar1 = (ChFrame *)
           (this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_148.m_data[0] = 1.0;
  local_148.m_data[1] = 0.0;
  local_148.m_data[2] = 0.0;
  local_148.m_data[3] = 0.0;
  local_b8._0_8_ = &PTR__ChFrame_0017db90;
  local_b8._8_8_ = 0.040288;
  local_b8._16_8_ = -0.001937;
  local_b8._24_8_ = -0.073574;
  local_b8._32_8_ = 1.0;
  local_b8._40_8_ = 0.0;
  local_b8._48_8_ = 0.0;
  local_b8._56_8_ = 0.0;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)(local_b8 + 0x40),&local_148);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar1);
  chrono::ChBody::SetInertiaXX
            ((this->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  chrono::ChBody::SetInertiaXY
            ((this->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  chrono::ChBody::SetBodyFixed
            (SUB81((this->super_RS_Part).m_body.
                   super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  local_128 = (this->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_120 = (this->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_120->_M_use_count = local_120->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_120->_M_use_count = local_120->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(system,&local_128);
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  this_00 = &(this->super_RS_Part).m_boxes;
  local_b8._0_8_ = VNULL;
  local_b8._8_8_ = _put;
  local_b8._16_8_ = _UpdateForces;
  local_b8._24_8_ = QUNIT;
  local_b8._32_8_ = _ChLinkMotorRotationSpeed;
  local_b8._40_8_ = _ChBody;
  local_b8._48_8_ = _ComputeMassProperties;
  local_b8._56_8_ = 0.257;
  local_b8._64_8_ = 0.5;
  local_70 = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)local_b8);
  local_b8._0_8_ = VNULL;
  local_b8._8_8_ = _put;
  local_b8._16_8_ = _UpdateForces;
  local_b8._24_8_ = QUNIT;
  local_b8._32_8_ = _ChLinkMotorRotationSpeed;
  local_b8._40_8_ = _ChBody;
  local_b8._48_8_ = _ComputeMassProperties;
  local_b8._56_8_ = 0.93;
  local_b8._64_8_ = 0.23;
  local_70 = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)local_b8);
  chrono::Q_from_AngZ(-0.38153);
  local_b8._0_8_ = 0.25393;
  local_b8._8_8_ = 0.075769;
  local_b8._16_8_ = 0.0;
  local_b8._24_8_ = local_148.m_data[0];
  local_b8._32_8_ = local_148.m_data[1];
  local_b8._40_8_ = local_148.m_data[2];
  local_b8._48_8_ = local_148.m_data[3];
  local_b8._56_8_ = 0.36257;
  local_b8._64_8_ = 0.23;
  local_70 = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)local_b8);
  chrono::Q_from_AngZ(0.38153);
  local_b8._0_8_ = -0.25393;
  local_b8._8_8_ = 0.075769;
  local_b8._16_8_ = 0.0;
  local_b8._24_8_ = local_148.m_data[0];
  local_b8._32_8_ = local_148.m_data[1];
  local_b8._40_8_ = local_148.m_data[2];
  local_b8._48_8_ = local_148.m_data[3];
  local_b8._56_8_ = 0.36257;
  local_b8._64_8_ = 0.23;
  local_70 = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)local_b8);
  chrono::Q_from_AngZ(0.38153);
  local_b8._0_8_ = 0.25393;
  local_b8._8_8_ = -0.075769;
  local_b8._16_8_ = 0.0;
  local_b8._24_8_ = local_148.m_data[0];
  local_b8._32_8_ = local_148.m_data[1];
  local_b8._40_8_ = local_148.m_data[2];
  local_b8._48_8_ = local_148.m_data[3];
  local_b8._56_8_ = 0.36257;
  local_b8._64_8_ = 0.23;
  local_70 = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)local_b8);
  chrono::Q_from_AngZ(-0.38153);
  local_b8._0_8_ = -0.25393;
  local_b8._8_8_ = -0.075769;
  local_b8._16_8_ = 0.0;
  local_b8._24_8_ = local_148.m_data[0];
  local_b8._32_8_ = local_148.m_data[1];
  local_b8._40_8_ = local_148.m_data[2];
  local_b8._48_8_ = local_148.m_data[3];
  local_b8._56_8_ = 0.36257;
  local_b8._64_8_ = 0.23;
  local_70 = 0.238;
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  emplace_back<chrono::robosimian::BoxShape>(this_00,(BoxShape *)local_b8);
  chrono::Q_from_AngZ(1.5707963267948966);
  chrono::Q_from_AngX(1.1868243267948966);
  this_01 = &(this->super_RS_Part).m_cylinders;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_148.m_data[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_148.m_data[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d8;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_d0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_d0 * local_148.m_data[1];
  auVar4 = vfmsub231sd_fma(auVar7,auVar2,auVar4);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_148.m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_c8;
  auVar4 = vfnmadd231sd_fma(auVar4,auVar8,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_148.m_data[3];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_c0;
  auVar7 = vfnmadd231sd_fma(auVar4,auVar10,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_d8 * local_148.m_data[1];
  auVar4 = vfmadd231sd_fma(auVar12,auVar2,auVar6);
  auVar4 = vfnmadd231sd_fma(auVar4,auVar10,auVar9);
  auVar4 = vfmadd231sd_fma(auVar4,auVar8,auVar11);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_d8 * local_148.m_data[2];
  auVar5 = vfmadd231sd_fma(auVar13,auVar2,auVar9);
  auVar5 = vfmadd231sd_fma(auVar5,auVar10,auVar6);
  auVar10 = vfnmadd231sd_fma(auVar5,auVar3,auVar11);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_d8 * local_148.m_data[3];
  auVar5 = vfmadd231sd_fma(auVar5,auVar2,auVar11);
  auVar5 = vfnmadd231sd_fma(auVar5,auVar8,auVar6);
  auVar5 = vfmadd231sd_fma(auVar5,auVar3,auVar9);
  local_b8._0_8_ = 0.41705;
  local_b8._8_8_ = 0.0;
  local_b8._16_8_ = -0.15864;
  local_b8._24_8_ = auVar7._0_8_;
  local_b8._32_8_ = auVar4._0_8_;
  local_b8._40_8_ = auVar10._0_8_;
  local_b8._48_8_ = auVar5._0_8_;
  local_b8._56_8_ = 0.05;
  local_b8._64_8_ = 0.144;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)local_b8);
  chrono::Q_from_AngX(1.5707963267948966);
  local_b8._0_8_ = 0.29326;
  local_b8._8_8_ = 0.2094;
  local_b8._16_8_ = 0.011499999999999996;
  local_b8._24_8_ = local_148.m_data[0];
  local_b8._32_8_ = local_148.m_data[1];
  local_b8._40_8_ = local_148.m_data[2];
  local_b8._48_8_ = local_148.m_data[3];
  local_b8._56_8_ = 0.05;
  local_b8._64_8_ = 0.145;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)local_b8);
  chrono::Q_from_AngX(1.5707963267948966);
  local_b8._0_8_ = -0.29326;
  local_b8._8_8_ = 0.2094;
  local_b8._16_8_ = 0.011499999999999996;
  local_b8._24_8_ = local_148.m_data[0];
  local_b8._32_8_ = local_148.m_data[1];
  local_b8._40_8_ = local_148.m_data[2];
  local_b8._48_8_ = local_148.m_data[3];
  local_b8._56_8_ = 0.05;
  local_b8._64_8_ = 0.145;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)local_b8);
  chrono::Q_from_AngX(1.5707963267948966);
  local_b8._0_8_ = -0.29326;
  local_b8._8_8_ = -0.2094;
  local_b8._16_8_ = 0.011499999999999996;
  local_b8._24_8_ = local_148.m_data[0];
  local_b8._32_8_ = local_148.m_data[1];
  local_b8._40_8_ = local_148.m_data[2];
  local_b8._48_8_ = local_148.m_data[3];
  local_b8._56_8_ = 0.05;
  local_b8._64_8_ = 0.145;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)local_b8);
  chrono::Q_from_AngX(1.5707963267948966);
  local_b8._0_8_ = 0.29326;
  local_b8._8_8_ = -0.2094;
  local_b8._16_8_ = 0.011499999999999996;
  local_b8._24_8_ = local_148.m_data[0];
  local_b8._32_8_ = local_148.m_data[1];
  local_b8._40_8_ = local_148.m_data[2];
  local_b8._48_8_ = local_148.m_data[3];
  local_b8._56_8_ = 0.05;
  local_b8._64_8_ = 0.145;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>(this_01,(CylinderShape *)local_b8);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_RS_Part).m_mesh_name,0,
             (char *)(this->super_RS_Part).m_mesh_name._M_string_length,0x16a4bc);
  (this->super_RS_Part).m_offset.m_data[0] = 0.0;
  (this->super_RS_Part).m_offset.m_data[1] = 0.0;
  (this->super_RS_Part).m_offset.m_data[2] = 0.0;
  (this->super_RS_Part).m_color.R = 0.4;
  (this->super_RS_Part).m_color.G = 0.4;
  (this->super_RS_Part).m_color.B = 0.7;
  return;
}

Assistant:

RS_Chassis::RS_Chassis(const std::string& name, bool fixed, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system), m_collide(false) {
    double mass = 46.658335;
    ChVector<> com(0.040288, -0.001937, -0.073574);
    ChVector<> inertia_xx(1.272134, 2.568776, 3.086984);
    ChVector<> inertia_xy(0.008890, -0.13942, 0.000325);

    m_body->SetIdentifier(0);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    m_body->SetBodyFixed(fixed);
    system->Add(m_body);

    // Create the set of primitive shapes
    m_boxes.push_back(BoxShape(VNULL, QUNIT, ChVector<>(0.257, 0.50, 0.238)));
    m_boxes.push_back(BoxShape(VNULL, QUNIT, ChVector<>(0.93, 0.230, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(+0.25393, +0.075769, 0), Q_from_AngZ(-0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(-0.25393, +0.075769, 0), Q_from_AngZ(+0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(+0.25393, -0.075769, 0), Q_from_AngZ(+0.38153), ChVector<>(0.36257, 0.23, 0.238)));
    m_boxes.push_back(
        BoxShape(ChVector<>(-0.25393, -0.075769, 0), Q_from_AngZ(-0.38153), ChVector<>(0.36257, 0.23, 0.238)));

    m_cylinders.push_back(CylinderShape(ChVector<>(0.417050, 0, -0.158640),
                                        Q_from_AngZ(CH_C_PI_2) * Q_from_AngX(CH_C_PI_2 - 0.383972), 0.05, 0.144));

    // Geometry for link0 (all limbs); these links are fixed to the chassis
    m_cylinders.push_back(
        CylinderShape(ChVector<>(+0.29326, +0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(-0.29326, +0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(-0.29326, -0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));
    m_cylinders.push_back(
        CylinderShape(ChVector<>(+0.29326, -0.20940, 0.03650 - 0.025), Q_from_AngX(CH_C_PI_2), 0.05, 0.145));

    // Set the name of the visualization mesh
    m_mesh_name = "robosim_chassis";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.4f, 0.4f, 0.7f);
}